

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_copySequencesToSeqStoreNoBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize,ZSTD_paramSwitch_e externalRepSearch)

{
  BYTE **ppBVar1;
  BYTE *pBVar2;
  uint uVar3;
  uint uVar4;
  ZSTD_CDict *pZVar5;
  ZSTD_compressedBlockState_t *pZVar6;
  BYTE *pBVar7;
  seqDef *psVar8;
  uint uVar9;
  undefined8 uVar10;
  bool bVar11;
  int iVar12;
  U32 offBase;
  ulong uVar13;
  BYTE *pBVar14;
  uint uVar15;
  size_t sVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  U32 UVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  uint local_a4;
  uint local_98;
  size_t local_70;
  repcodes_t updatedRepcodes;
  
  uVar3 = seqPos->posInSequence;
  pBVar14 = (BYTE *)((long)src + blockSize);
  pZVar5 = cctx->cdict;
  if (pZVar5 == (ZSTD_CDict *)0x0) {
    if ((cctx->prefixDict).dict == (void *)0x0) {
      local_70 = 0;
      goto LAB_005d484c;
    }
    pZVar5 = (ZSTD_CDict *)&cctx->prefixDict;
  }
  local_70 = pZVar5->dictContentSize;
LAB_005d484c:
  UVar20 = seqPos->idx;
  pZVar6 = (cctx->blockState).prevCBlock;
  updatedRepcodes.rep[2] = pZVar6->rep[2];
  updatedRepcodes.rep._0_8_ = *(undefined8 *)pZVar6->rep;
  bVar11 = false;
  local_a4 = 0;
  uVar21 = uVar3 + (int)blockSize;
  while (uVar13 = (ulong)UVar20, uVar24 = local_a4, uVar21 != 0) {
    uVar15 = uVar21;
    if ((bVar11) || (inSeqsSize <= uVar13)) goto LAB_005d4c09;
    uVar4 = inSeqs[uVar13].litLength;
    uVar23 = inSeqs[uVar13].matchLength;
    uVar22 = uVar23 + uVar4;
    uVar19 = uVar22 - uVar21;
    if (uVar22 < uVar21 || uVar19 == 0) {
      uVar25 = (ulong)(uVar4 - uVar3);
      if (uVar4 < uVar3) {
        uVar25 = 0;
      }
      iVar12 = uVar3 - uVar4;
      bVar11 = false;
      if (uVar3 < uVar4) {
        iVar12 = 0;
      }
      uVar23 = uVar23 - iVar12;
      uVar3 = 0;
      local_98 = uVar22;
    }
    else {
      uVar17 = uVar21 - uVar4;
      if (uVar21 < uVar4 || uVar17 == 0) goto LAB_005d4c09;
      uVar9 = uVar4 - uVar3;
      if (uVar4 < uVar3) {
        uVar9 = 0;
      }
      uVar25 = (ulong)uVar9;
      uVar15 = uVar4;
      uVar24 = uVar17;
      if (uVar23 <= blockSize) goto LAB_005d4c09;
      uVar23 = uVar21 - (uVar3 + uVar9);
      uVar4 = (cctx->appliedParams).cParams.minMatch;
      if (uVar23 < uVar4) goto LAB_005d4c09;
      local_98 = uVar4 - uVar19;
      if (uVar4 >= uVar19 && local_98 != 0) {
        local_a4 = local_98;
      }
      if (uVar4 < uVar19) {
        local_98 = 0;
      }
      uVar23 = uVar23 - local_98;
      bVar11 = true;
    }
    uVar24 = (uint)uVar25;
    offBase = ZSTD_finalizeOffBase(inSeqs[uVar13].offset,updatedRepcodes.rep,(uint)(uVar24 == 0));
    ZSTD_updateRep(updatedRepcodes.rep,offBase,(uint)(uVar24 == 0));
    if ((cctx->appliedParams).validateSequences != 0) {
      sVar16 = (ulong)(uVar23 + uVar24) + seqPos->posInSrc;
      seqPos->posInSrc = sVar16;
      sVar16 = ZSTD_validateSequence
                         (offBase,uVar23,(cctx->appliedParams).cParams.minMatch,sVar16,
                          (cctx->appliedParams).cParams.windowLog,local_70,
                          (cctx->appliedParams).useSequenceProducer);
      if (0xffffffffffffff88 < sVar16) {
        return sVar16;
      }
    }
    uVar13 = (cctx->seqStore).maxNbSeq;
    if (uVar13 <= UVar20 - seqPos->idx) {
      return 0xffffffffffffff95;
    }
    if (uVar13 <= (ulong)((long)(cctx->seqStore).sequences - (long)(cctx->seqStore).sequencesStart
                         >> 3)) {
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar13 = (cctx->seqStore).maxNbLit;
    if (0x20000 < uVar13) {
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    pBVar7 = (cctx->seqStore).lit;
    if ((cctx->seqStore).litStart + uVar13 < pBVar7 + uVar25) {
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a0,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    pBVar2 = (BYTE *)((long)src + uVar25);
    if (pBVar14 < pBVar2) {
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a1,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (pBVar14 + -0x20 < pBVar2) {
      ZSTD_safecopyLiterals(pBVar7,(BYTE *)src,pBVar2,pBVar14 + -0x20);
LAB_005d4a9d:
      ppBVar1 = &(cctx->seqStore).lit;
      *ppBVar1 = *ppBVar1 + uVar25;
      if (0xffff < uVar24) {
        if ((cctx->seqStore).longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2b2,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        (cctx->seqStore).longLengthType = ZSTD_llt_literalLength;
        (cctx->seqStore).longLengthPos =
             (U32)((ulong)((long)(cctx->seqStore).sequences - (long)(cctx->seqStore).sequencesStart)
                  >> 3);
      }
    }
    else {
      uVar10 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar7 = *src;
      *(undefined8 *)(pBVar7 + 8) = uVar10;
      if (0x10 < uVar24) {
        pBVar7 = (cctx->seqStore).lit;
        if ((BYTE *)0xffffffffffffffe0 < pBVar7 + 0x10 + (-0x10 - ((long)src + 0x10))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                        ,0xe9,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar10 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar7 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar7 + 0x18) = uVar10;
        if (0x10 < uVar25 - 0x10) {
          lVar18 = 0;
          do {
            uVar10 = *(undefined8 *)((BYTE *)((long)src + lVar18 + 0x20) + 8);
            pBVar2 = pBVar7 + lVar18 + 0x20;
            *(undefined8 *)pBVar2 = *(undefined8 *)((long)src + lVar18 + 0x20);
            *(undefined8 *)(pBVar2 + 8) = uVar10;
            uVar10 = *(undefined8 *)((BYTE *)((long)src + lVar18 + 0x30) + 8);
            *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)((long)src + lVar18 + 0x30);
            *(undefined8 *)(pBVar2 + 0x18) = uVar10;
            lVar18 = lVar18 + 0x20;
          } while (pBVar2 + 0x20 < pBVar7 + uVar25);
          goto LAB_005d4a9d;
        }
      }
      ppBVar1 = &(cctx->seqStore).lit;
      *ppBVar1 = *ppBVar1 + uVar25;
    }
    psVar8 = (cctx->seqStore).sequences;
    psVar8->litLength = (U16)uVar25;
    psVar8->offBase = offBase;
    if (uVar23 < 3) {
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,700,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < (ulong)uVar23 - 3) {
      if ((cctx->seqStore).longLengthType != ZSTD_llt_none) {
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2bf,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      (cctx->seqStore).longLengthType = ZSTD_llt_matchLength;
      (cctx->seqStore).longLengthPos =
           (U32)((ulong)((long)psVar8 - (long)(cctx->seqStore).sequencesStart) >> 3);
    }
    src = (void *)((long)src + (ulong)(uVar23 + uVar24));
    psVar8->mlBase = (U16)((ulong)uVar23 - 3);
    (cctx->seqStore).sequences = psVar8 + 1;
    UVar20 = (UVar20 + 1) - (uint)(uVar21 < uVar22);
    uVar21 = uVar21 - local_98;
  }
  uVar15 = 0;
LAB_005d4c09:
  if ((uVar13 != inSeqsSize) && (inSeqs[uVar13].matchLength + inSeqs[uVar13].litLength < uVar15)) {
    __assert_fail("idx == inSeqsSize || endPosInSequence <= inSeqs[idx].litLength + inSeqs[idx].matchLength"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x19b7,
                  "size_t ZSTD_copySequencesToSeqStoreNoBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                 );
  }
  seqPos->idx = UVar20;
  seqPos->posInSequence = uVar15;
  pZVar6 = (cctx->blockState).nextCBlock;
  pZVar6->rep[2] = updatedRepcodes.rep[2];
  *(undefined8 *)pZVar6->rep = updatedRepcodes.rep._0_8_;
  pBVar14 = pBVar14 + -(ulong)uVar24;
  if ((BYTE *)src != pBVar14) {
    if (pBVar14 < src) {
      __assert_fail("ip <= iend",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x19c0,
                    "size_t ZSTD_copySequencesToSeqStoreNoBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                   );
    }
    uVar13 = (ulong)(uint)((int)pBVar14 - (int)src);
    memcpy((cctx->seqStore).lit,src,uVar13);
    ppBVar1 = &(cctx->seqStore).lit;
    *ppBVar1 = *ppBVar1 + uVar13;
    seqPos->posInSrc = seqPos->posInSrc + uVar13;
  }
  return (ulong)uVar24;
}

Assistant:

size_t
ZSTD_copySequencesToSeqStoreNoBlockDelim(ZSTD_CCtx* cctx, ZSTD_sequencePosition* seqPos,
                                   const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                   const void* src, size_t blockSize, ZSTD_paramSwitch_e externalRepSearch)
{
    U32 idx = seqPos->idx;
    U32 startPosInSequence = seqPos->posInSequence;
    U32 endPosInSequence = seqPos->posInSequence + (U32)blockSize;
    size_t dictSize;
    BYTE const* ip = (BYTE const*)(src);
    BYTE const* iend = ip + blockSize;  /* May be adjusted if we decide to process fewer than blockSize bytes */
    repcodes_t updatedRepcodes;
    U32 bytesAdjustment = 0;
    U32 finalMatchSplit = 0;

    /* TODO(embg) support fast parsing mode in noBlockDelim mode */
    (void)externalRepSearch;

    if (cctx->cdict) {
        dictSize = cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    DEBUGLOG(5, "ZSTD_copySequencesToSeqStoreNoBlockDelim: idx: %u PIS: %u blockSize: %zu", idx, startPosInSequence, blockSize);
    DEBUGLOG(5, "Start seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    while (endPosInSequence && idx < inSeqsSize && !finalMatchSplit) {
        const ZSTD_Sequence currSeq = inSeqs[idx];
        U32 litLength = currSeq.litLength;
        U32 matchLength = currSeq.matchLength;
        U32 const rawOffset = currSeq.offset;
        U32 offBase;

        /* Modify the sequence depending on where endPosInSequence lies */
        if (endPosInSequence >= currSeq.litLength + currSeq.matchLength) {
            if (startPosInSequence >= litLength) {
                startPosInSequence -= litLength;
                litLength = 0;
                matchLength -= startPosInSequence;
            } else {
                litLength -= startPosInSequence;
            }
            /* Move to the next sequence */
            endPosInSequence -= currSeq.litLength + currSeq.matchLength;
            startPosInSequence = 0;
        } else {
            /* This is the final (partial) sequence we're adding from inSeqs, and endPosInSequence
               does not reach the end of the match. So, we have to split the sequence */
            DEBUGLOG(6, "Require a split: diff: %u, idx: %u PIS: %u",
                     currSeq.litLength + currSeq.matchLength - endPosInSequence, idx, endPosInSequence);
            if (endPosInSequence > litLength) {
                U32 firstHalfMatchLength;
                litLength = startPosInSequence >= litLength ? 0 : litLength - startPosInSequence;
                firstHalfMatchLength = endPosInSequence - startPosInSequence - litLength;
                if (matchLength > blockSize && firstHalfMatchLength >= cctx->appliedParams.cParams.minMatch) {
                    /* Only ever split the match if it is larger than the block size */
                    U32 secondHalfMatchLength = currSeq.matchLength + currSeq.litLength - endPosInSequence;
                    if (secondHalfMatchLength < cctx->appliedParams.cParams.minMatch) {
                        /* Move the endPosInSequence backward so that it creates match of minMatch length */
                        endPosInSequence -= cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        bytesAdjustment = cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        firstHalfMatchLength -= bytesAdjustment;
                    }
                    matchLength = firstHalfMatchLength;
                    /* Flag that we split the last match - after storing the sequence, exit the loop,
                       but keep the value of endPosInSequence */
                    finalMatchSplit = 1;
                } else {
                    /* Move the position in sequence backwards so that we don't split match, and break to store
                     * the last literals. We use the original currSeq.litLength as a marker for where endPosInSequence
                     * should go. We prefer to do this whenever it is not necessary to split the match, or if doing so
                     * would cause the first half of the match to be too small
                     */
                    bytesAdjustment = endPosInSequence - currSeq.litLength;
                    endPosInSequence = currSeq.litLength;
                    break;
                }
            } else {
                /* This sequence ends inside the literals, break to store the last literals */
                break;
            }
        }
        /* Check if this offset can be represented with a repcode */
        {   U32 const ll0 = (litLength == 0);
            offBase = ZSTD_finalizeOffBase(rawOffset, updatedRepcodes.rep, ll0);
            ZSTD_updateRep(updatedRepcodes.rep, offBase, ll0);
        }

        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offBase, matchLength, cctx->appliedParams.cParams.minMatch, seqPos->posInSrc,
                                                   cctx->appliedParams.cParams.windowLog, dictSize, cctx->appliedParams.useSequenceProducer),
                                                   "Sequence validation failed");
        }
        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offBase, matchLength, litLength);
        RETURN_ERROR_IF(idx - seqPos->idx >= cctx->seqStore.maxNbSeq, externalSequences_invalid,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offBase, matchLength);
        ip += matchLength + litLength;
        if (!finalMatchSplit)
            idx++; /* Next Sequence */
    }
    DEBUGLOG(5, "Ending seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    assert(idx == inSeqsSize || endPosInSequence <= inSeqs[idx].litLength + inSeqs[idx].matchLength);
    seqPos->idx = idx;
    seqPos->posInSequence = endPosInSequence;
    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    iend -= bytesAdjustment;
    if (ip != iend) {
        /* Store any last literals */
        U32 lastLLSize = (U32)(iend - ip);
        assert(ip <= iend);
        DEBUGLOG(6, "Storing last literals of size: %u", lastLLSize);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, lastLLSize);
        seqPos->posInSrc += lastLLSize;
    }

    return bytesAdjustment;
}